

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_xml_generator.cc
# Opt level: O1

void __thiscall t_xml_generator::init_generator(t_xml_generator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  int *piVar3;
  long *plVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  char *__rhs;
  long *plVar5;
  size_type *psVar6;
  string f_xml_name;
  allocator local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  char *local_48 [2];
  char local_38 [16];
  
  (*(this->super_t_generator)._vptr_t_generator[0x1b])(&local_88,this);
  iVar2 = mkdir(local_88._M_dataplus._M_p,0x1ff);
  paVar1 = &local_88.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if (iVar2 == -1) {
    piVar3 = __errno_location();
    if (*piVar3 != 0x11) {
      __return_storage_ptr__ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_allocate_exception(0x20);
      (*(this->super_t_generator)._vptr_t_generator[0x1b])(local_48,this);
      std::__cxx11::string::string((string *)&local_68,local_48[0],&local_89);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_68);
      local_88._M_dataplus._M_p = (pointer)*plVar4;
      psVar6 = (size_type *)(plVar4 + 2);
      if ((size_type *)local_88._M_dataplus._M_p == psVar6) {
        local_88.field_2._M_allocated_capacity = *psVar6;
        local_88.field_2._8_8_ = plVar4[3];
        local_88._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_88.field_2._M_allocated_capacity = *psVar6;
      }
      local_88._M_string_length = plVar4[1];
      *plVar4 = (long)psVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      __rhs = strerror(*piVar3);
      std::operator+(__return_storage_ptr__,&local_88,__rhs);
      __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                  std::__cxx11::string::~string);
    }
  }
  (*(this->super_t_generator)._vptr_t_generator[0x1b])(local_48,this);
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_48,
                              (ulong)(((this->super_t_generator).program_)->name_)._M_dataplus._M_p)
  ;
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    local_58 = *plVar5;
    lStack_50 = plVar4[3];
    local_68 = &local_58;
  }
  else {
    local_58 = *plVar5;
    local_68 = (long *)*plVar4;
  }
  local_60 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_68);
  psVar6 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_88.field_2._M_allocated_capacity = *psVar6;
    local_88.field_2._8_8_ = plVar4[3];
    local_88._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_88.field_2._M_allocated_capacity = *psVar6;
    local_88._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_88._M_string_length = plVar4[1];
  *plVar4 = (long)psVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_68 != &local_58) {
    operator_delete(local_68);
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  std::__cxx11::string::string((string *)&local_68,local_88._M_dataplus._M_p,(allocator *)local_48);
  std::__cxx11::string::_M_assign
            ((string *)
             &(this->f_xml_).super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
              field_0x70);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::clear_buf
            (&this->f_xml_);
  (this->f_xml_).super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x90 =
       0;
  if (local_68 != &local_58) {
    operator_delete(local_68);
  }
  this->top_element_is_open = false;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_xml_generator::init_generator() {
  MKDIR(get_out_dir().c_str());

  string f_xml_name = get_out_dir() + program_->get_name() + ".xml";
  f_xml_.open(f_xml_name.c_str());

  top_element_is_open = false;
}